

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall TlbExport::save(TlbExport *this,ostream *stream,RegistryIterator *type)

{
  RegistryIterator *stream_00;
  bool bVar1;
  ostream *poVar2;
  RegistryIterator local_148 [39];
  allocator local_121;
  string local_120 [32];
  undefined1 local_100 [8];
  TlbExportVisitor exporter;
  anon_unknown_dwarf_39db local_90 [48];
  RegistryIterator local_60 [32];
  anon_unknown_dwarf_39db local_40 [32];
  RegistryIterator *local_20;
  RegistryIterator *type_local;
  ostream *stream_local;
  TlbExport *this_local;
  
  local_20 = type;
  type_local = (RegistryIterator *)stream;
  stream_local = (ostream *)this;
  bVar1 = Typelib::RegistryIterator::isAlias(type);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)type_local,"  <alias name=\"");
    Typelib::RegistryIterator::getName_abi_cxx11_(local_60);
    anon_unknown.dwarf_39db::xmlEscape(local_40,(string *)local_60);
    poVar2 = std::operator<<(poVar2,(string *)local_40);
    poVar2 = std::operator<<(poVar2,"\" source=\"");
    boost::iterators::detail::
    iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
    ::operator->((iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
                  *)local_20);
    Typelib::Type::getName_abi_cxx11_();
    anon_unknown.dwarf_39db::xmlEscape(local_90,(string *)&exporter.field_0x48);
    poVar2 = std::operator<<(poVar2,(string *)local_90);
    std::operator<<(poVar2,"\"/>\n");
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)&exporter.field_0x48);
    std::__cxx11::string::~string((string *)local_40);
    std::__cxx11::string::~string((string *)local_60);
  }
  else {
    std::operator<<((ostream *)type_local,"  ");
    stream_00 = type_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"  ",&local_121);
    Typelib::RegistryIterator::getSource_abi_cxx11_(local_148);
    anon_unknown.dwarf_39db::TlbExportVisitor::TlbExportVisitor
              ((TlbExportVisitor *)local_100,(ostream *)stream_00,(string *)local_120,
               (string *)local_148);
    std::__cxx11::string::~string((string *)local_148);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    boost::iterators::detail::
    iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
    ::operator*((iterator_facade_base<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long,_false,_false>
                 *)local_20);
    Typelib::TypeVisitor::apply((Type *)local_100);
    std::operator<<((ostream *)type_local,"\n");
    anon_unknown.dwarf_39db::TlbExportVisitor::~TlbExportVisitor((TlbExportVisitor *)local_100);
  }
  return true;
}

Assistant:

bool TlbExport::save
    ( ostream& stream
    , Typelib::RegistryIterator const& type )
{
    if (type.isAlias())
    {
        stream << "  <alias "
            "name=\"" << xmlEscape(type.getName()) << "\" "
            "source=\"" << xmlEscape(type->getName()) << "\"/>\n";
    }
    else
    {
        stream << "  ";
        TlbExportVisitor exporter(stream, "  ", type.getSource());
        exporter.apply(*type);
        stream << "\n";
    }
    return true;
}